

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_info.cpp
# Opt level: O1

sha256_hash * __thiscall libtorrent::v1_2::peer_info::i2p_destination(peer_info *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  sha256_hash *in_RDI;
  
  (in_RDI->m_number)._M_elems[4] = 0;
  (in_RDI->m_number)._M_elems[5] = 0;
  (in_RDI->m_number)._M_elems[6] = 0;
  (in_RDI->m_number)._M_elems[7] = 0;
  (in_RDI->m_number)._M_elems[0] = 0;
  (in_RDI->m_number)._M_elems[1] = 0;
  (in_RDI->m_number)._M_elems[2] = 0;
  (in_RDI->m_number)._M_elems[3] = 0;
  if (((this->flags).m_val & 0x10000) != 0) {
    uVar1 = *(undefined8 *)&(this->ip).impl_.data_;
    uVar2 = *(undefined8 *)((long)&(this->ip).impl_.data_ + 8);
    uVar3 = *(undefined8 *)((long)&(this->ip).impl_.data_ + 0x18);
    *(undefined8 *)((in_RDI->m_number)._M_elems + 4) =
         *(undefined8 *)((long)&(this->ip).impl_.data_ + 0x10);
    *(undefined8 *)((in_RDI->m_number)._M_elems + 6) = uVar3;
    *(undefined8 *)(in_RDI->m_number)._M_elems = uVar1;
    *(undefined8 *)((in_RDI->m_number)._M_elems + 2) = uVar2;
  }
  return in_RDI;
}

Assistant:

sha256_hash peer_info::i2p_destination() const
	{
		sha256_hash ret;
		if (!(flags & i2p_socket)) return ret;

		char const* destination = reinterpret_cast<char const*>(&ip);
		static_assert(sizeof(tcp::endpoint) * 2 >= sizeof(sha256_hash), "tcp::endpoint is smaller than expected");

		std::memcpy(ret.data(), destination, ret.size());
		return ret;
	}